

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O1

void Ssw_MatchingComplete(Aig_Man_t *p0,Aig_Man_t *p1)

{
  void *pvVar1;
  uint uVar2;
  uint *__ptr;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  Aig_Obj_t *p1_00;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr + 2) = pvVar3;
  if (0 < p0->nRegs) {
    iVar9 = 0;
    do {
      uVar2 = p0->nTruePos + iVar9;
      if (((((int)uVar2 < 0) || (p0->vCos->nSize <= (int)uVar2)) ||
          (uVar8 = p0->nTruePis + iVar9, (int)uVar8 < 0)) || (p0->vCis->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = p0->vCis->pArray[uVar8];
      if (*(long *)((long)pvVar3 + 0x28) == 0) {
        pvVar1 = p0->vCos->pArray[uVar2];
        pAVar4 = Aig_ObjCreateCi(p1);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
        (pAVar4->field_5).pData = pvVar3;
        uVar2 = __ptr[1];
        uVar8 = *__ptr;
        if (uVar2 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc(0x80);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar12 = 0x10;
          }
          else {
            uVar12 = uVar8 * 2;
            if ((int)uVar12 <= (int)uVar8) goto LAB_006a628b;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar3 = malloc((ulong)uVar8 << 4);
            }
            else {
              pvVar3 = realloc(*(void **)(__ptr + 2),(ulong)uVar8 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar3;
          *__ptr = uVar12;
        }
LAB_006a628b:
        __ptr[1] = uVar2 + 1;
        *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = pvVar1;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < p0->nRegs);
  }
  pVVar5 = p0->vObjs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar10];
      if (((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) &&
         (*(long *)((long)pvVar3 + 0x28) == 0)) {
        if (((ulong)pvVar3 & 1) != 0) goto LAB_006a63e2;
        uVar6 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1_00 = (Aig_Obj_t *)0x0;
        }
        else {
          p1_00 = (Aig_Obj_t *)
                  ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar4 = Aig_And(p1,pAVar4,p1_00);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
        (pAVar4->field_5).pData = pvVar3;
      }
      lVar10 = lVar10 + 1;
      pVVar5 = p0->vObjs;
    } while (lVar10 < pVVar5->nSize);
  }
  uVar2 = __ptr[1];
  if (0 < (long)(int)uVar2) {
    lVar10 = *(long *)(__ptr + 2);
    lVar11 = 0;
    do {
      uVar6 = *(ulong *)(lVar10 + lVar11 * 8);
      if ((uVar6 & 1) != 0) {
LAB_006a63e2:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)(uVar6 + 8);
      uVar7 = uVar6 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      Aig_ObjCreateCo(p1,pAVar4);
      lVar11 = lVar11 + 1;
    } while ((int)uVar2 != lVar11);
  }
  Aig_ManSetRegNum(p1,uVar2 + p1->nRegs);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Ssw_MatchingComplete( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNewLis;
    Aig_Obj_t * pObj0, * pObj0Li, * pObj1;
    int i;
    // create register outputs in p0 that are absent in p1
    vNewLis = Vec_PtrAlloc( 100 );
    Saig_ManForEachLiLo( p0, pObj0Li, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_ObjCreateCi( p1 );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
        Vec_PtrPush( vNewLis, pObj0Li );
    }
    // add missing nodes in the topological order
    Aig_ManForEachNode( p0, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_And( p1, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
    }
    // create register outputs in p0 that are absent in p1
    Vec_PtrForEachEntry( Aig_Obj_t *, vNewLis, pObj0Li, i )
        Aig_ObjCreateCo( p1, Aig_ObjChild0Copy(pObj0Li) );
    // increment the number of registers
    Aig_ManSetRegNum( p1, Aig_ManRegNum(p1) + Vec_PtrSize(vNewLis) );
    Vec_PtrFree( vNewLis );
}